

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::AddTargetObject(cmMakefile *this,string *tgtName,string *objFile)

{
  size_t sVar1;
  pointer pcVar2;
  cmSourceFile *this_00;
  string *name;
  allocator local_39;
  string local_38;
  
  this_00 = GetOrCreateSource(this,objFile,true);
  cmSourceFile::SetObjectLibrary(this_00,tgtName);
  std::__cxx11::string::string((string *)&local_38,"EXTERNAL_OBJECT",&local_39);
  cmSourceFile::SetProperty(this_00,&local_38,"1");
  std::__cxx11::string::~string((string *)&local_38);
  sVar1 = this->ObjectLibrariesSourceGroupIndex;
  pcVar2 = (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
           _M_impl.super__Vector_impl_data._M_start;
  name = cmSourceFile::GetFullPath(this_00,(string *)0x0);
  cmSourceGroup::AddGroupFile(pcVar2 + sVar1,name);
  return;
}

Assistant:

void cmMakefile::AddTargetObject(std::string const& tgtName,
                                 std::string const& objFile)
{
  cmSourceFile* sf = this->GetOrCreateSource(objFile, true);
  sf->SetObjectLibrary(tgtName);
  sf->SetProperty("EXTERNAL_OBJECT", "1");
#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->SourceGroups[this->ObjectLibrariesSourceGroupIndex].AddGroupFile(
    sf->GetFullPath());
#endif
}